

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-alloc.c
# Opt level: O0

void ggml_gallocr_allocate_node(ggml_gallocr_t galloc,ggml_tensor *node,int buffer_id)

{
  ggml_tensor *b;
  ggml_tensor *pgVar1;
  _Bool _Var2;
  hash_node *phVar3;
  hash_node *phVar4;
  hash_node *phVar5;
  size_t sVar6;
  int in_EDX;
  ggml_tensor *in_RSI;
  long *in_RDI;
  size_t offset;
  size_t size;
  ggml_backend_buffer_type_t buft;
  ggml_dyn_tallocr *alloc;
  hash_node *view_src_hn;
  ggml_tensor *view_src;
  hash_node *p_hn;
  ggml_tensor *parent;
  int i;
  hash_node *hn;
  ggml_tensor *in_stack_ffffffffffffff98;
  ggml_tensor *in_stack_ffffffffffffffa0;
  int local_24;
  
  if (in_EDX < 0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-alloc.c"
               ,0x1df,"GGML_ASSERT(%s) failed","buffer_id >= 0");
  }
  phVar3 = ggml_gallocr_hash_get
                     ((ggml_gallocr_t)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  _Var2 = ggml_gallocr_is_allocated
                    ((ggml_gallocr_t)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if ((!_Var2) && (_Var2 = ggml_is_view(in_RSI), !_Var2)) {
    phVar3->allocated = true;
    _Var2 = ggml_op_can_inplace(in_RSI->op);
    if (_Var2) {
      for (local_24 = 0; local_24 < 10; local_24 = local_24 + 1) {
        b = in_RSI->src[local_24];
        if ((((b != (ggml_tensor *)0x0) &&
             (_Var2 = ggml_gallocr_is_own((ggml_gallocr_t)in_stack_ffffffffffffffa0,
                                          in_stack_ffffffffffffff98), _Var2)) &&
            ((b->flags & 2U) == 0)) &&
           (((b->view_src == (ggml_tensor *)0x0 || ((b->view_src->flags & 2U) == 0)) &&
            ((_Var2 = ggml_are_same_layout(in_RSI,b), _Var2 &&
             ((phVar4 = ggml_gallocr_hash_get
                                  ((ggml_gallocr_t)in_stack_ffffffffffffffa0,
                                   in_stack_ffffffffffffff98), phVar4->n_children == 1 &&
              (phVar4->n_views == 0)))))))) {
          _Var2 = ggml_is_view(b);
          if (!_Var2) {
            phVar3->buffer_id = phVar4->buffer_id;
            phVar3->offset = phVar4->offset;
            phVar4->allocated = false;
            return;
          }
          pgVar1 = b->view_src;
          phVar5 = ggml_gallocr_hash_get
                             ((ggml_gallocr_t)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
          if (((phVar5->n_views == 1) && (phVar5->n_children == 0)) && (pgVar1->data == b->data)) {
            phVar3->buffer_id = phVar4->buffer_id;
            phVar3->offset = phVar4->offset;
            phVar4->allocated = false;
            phVar5->allocated = false;
            return;
          }
        }
      }
    }
    ggml_backend_buft_get_alloc_size
              (*(ggml_backend_buffer_type_t *)(*in_RDI + (long)in_EDX * 8),in_stack_ffffffffffffffa0
              );
    sVar6 = ggml_dyn_tallocr_alloc((ggml_dyn_tallocr *)offset,(size_t)in_RDI,in_RSI);
    phVar3->buffer_id = in_EDX;
    phVar3->offset = sVar6;
  }
  return;
}

Assistant:

static void ggml_gallocr_allocate_node(ggml_gallocr_t galloc, struct ggml_tensor * node, int buffer_id) {
    GGML_ASSERT(buffer_id >= 0);
    struct hash_node * hn = ggml_gallocr_hash_get(galloc, node);

    if (!ggml_gallocr_is_allocated(galloc, node) && !ggml_is_view(node)) {
        hn->allocated = true;
        assert(hn->offset == 0);

        // try to reuse a parent's buffer (inplace)
        if (ggml_op_can_inplace(node->op)) {
            for (int i = 0; i < GGML_MAX_SRC; i++) {
                struct ggml_tensor * parent = node->src[i];
                if (parent == NULL) {
                    continue;
                }

                // if the node's data is external, then we cannot re-use it
                if (!ggml_gallocr_is_own(galloc, parent)) {
                    AT_PRINTF("not reusing parent %s for %s as %p is external\n", parent->name, node->name, parent->data);
                    continue;
                }

                // outputs cannot be reused
                if (parent->flags & GGML_TENSOR_FLAG_OUTPUT || (parent->view_src != NULL && parent->view_src->flags & GGML_TENSOR_FLAG_OUTPUT)) {
                    AT_PRINTF("not reusing parent %s for %s as it is an output\n", parent->name, node->name);
                    continue;
                }

                if (!ggml_are_same_layout(node, parent)) {
                    AT_PRINTF("not reusing parent %s for %s as layouts are different\n", parent->name, node->name);
                    continue;
                }

                struct hash_node * p_hn = ggml_gallocr_hash_get(galloc, parent);
                if (p_hn->n_children == 1 && p_hn->n_views == 0) {
                    if (ggml_is_view(parent)) {
                        struct ggml_tensor * view_src = parent->view_src;
                        struct hash_node * view_src_hn = ggml_gallocr_hash_get(galloc, view_src);
                        if (view_src_hn->n_views == 1 && view_src_hn->n_children == 0 && view_src->data == parent->data) {
                            AT_PRINTF("reusing view parent %s (%s) for %s\n", parent->name, view_src->name, node->name);
                            assert(view_src_hn->offset == p_hn->offset);
                            hn->buffer_id = p_hn->buffer_id;
                            hn->offset = p_hn->offset;
                            p_hn->allocated = false; // avoid freeing the parent
                            view_src_hn->allocated = false;
                            return;
                        }
                    } else {
                        AT_PRINTF("reusing parent %s for %s\n", parent->name, node->name);
                        hn->buffer_id = p_hn->buffer_id;
                        hn->offset = p_hn->offset;
                        p_hn->allocated = false; // avoid freeing the parent
                        return;
                    }
                }
            }
        }
        // allocate tensor from the buffer
        struct ggml_dyn_tallocr * alloc = galloc->buf_tallocs[buffer_id];
        ggml_backend_buffer_type_t buft = galloc->bufts[buffer_id];
        size_t size = ggml_backend_buft_get_alloc_size(buft, node);
        size_t offset = ggml_dyn_tallocr_alloc(alloc, size, node);
        hn->buffer_id = buffer_id;
        hn->offset = offset;
    }
}